

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

ostream * nlohmann::operator<<
                    (ostream *o,
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *j)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  locale old_locale;
  locale alStack_38 [8];
  locale local_30 [8];
  
  lVar1 = *(long *)(o + *(long *)(*(long *)o + -0x18) + 0x10);
  lVar3 = lVar1;
  if (lVar1 < 1) {
    lVar3 = 0;
  }
  *(undefined8 *)(o + *(long *)(*(long *)o + -0x18) + 0x10) = 0;
  std::locale::classic();
  std::ios::imbue(alStack_38);
  uVar2 = *(undefined8 *)(o + *(long *)(*(long *)o + -0x18) + 8);
  *(undefined8 *)(o + *(long *)(*(long *)o + -0x18) + 8) = 0xf;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(j,o,0 < lVar1,(uint)lVar3,0);
  std::ios::imbue(local_30);
  std::locale::~locale(local_30);
  *(undefined8 *)(o + *(long *)(*(long *)o + -0x18) + 8) = uVar2;
  std::locale::~locale(alStack_38);
  return o;
}

Assistant:

friend std::ostream& operator<<(std::ostream& o, const basic_json& j)
    {
        // read width member and use it as indentation parameter if nonzero
        const bool pretty_print = (o.width() > 0);
        const auto indentation = (pretty_print ? o.width() : 0);

        // reset width to 0 for subsequent calls to this stream
        o.width(0);

        // fix locale problems
        const auto old_locale = o.imbue(std::locale::classic());
        // set precision

        // 6, 15 or 16 digits of precision allows round-trip IEEE 754
        // string->float->string, string->double->string or string->long
        // double->string; to be safe, we read this value from
        // std::numeric_limits<number_float_t>::digits10
        const auto old_precision = o.precision(std::numeric_limits<double>::digits10);

        // do the actual serialization
        j.dump(o, pretty_print, static_cast<unsigned int>(indentation));

        // reset locale and precision
        o.imbue(old_locale);
        o.precision(old_precision);
        return o;
    }